

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O0

char * GetADSBEmitterCat(string *cat)

{
  long lVar1;
  char *pcVar2;
  undefined1 *puVar3;
  ulong in_RDI;
  char *local_8;
  
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 2) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    return pcVar2;
  }
  puVar3 = (undefined1 *)std::__cxx11::string::operator[](in_RDI);
  switch(*puVar3) {
  case 0x41:
    puVar3 = (undefined1 *)std::__cxx11::string::operator[](in_RDI);
    switch(*puVar3) {
    case 0x30:
      local_8 = "Category A - No Info";
      return local_8;
    case 0x31:
      local_8 = "Light (<15500 lbs)";
      return local_8;
    case 0x32:
      local_8 = "Small (15500-75000 lbs)";
      return local_8;
    case 0x33:
      local_8 = "Large (75000-300000 lbs)";
      return local_8;
    case 0x34:
      local_8 = "High-Vortex Large";
      return local_8;
    case 0x35:
      local_8 = "Heavy (>300000 lbs)";
      return local_8;
    case 0x36:
      local_8 = "High Performance";
      return local_8;
    case 0x37:
      local_8 = "Rotorcraft";
      return local_8;
    }
    break;
  case 0x42:
    puVar3 = (undefined1 *)std::__cxx11::string::operator[](in_RDI);
    switch(*puVar3) {
    case 0x30:
      local_8 = "Category B - No Info";
      return local_8;
    case 0x31:
      local_8 = "Glider / Sailplane";
      return local_8;
    case 0x32:
      local_8 = "Lighter-than-Air";
      return local_8;
    case 0x33:
      local_8 = "Parachutist / Skydiver";
      return local_8;
    case 0x34:
      local_8 = "Ultralight / hang-glider / paraglider";
      return local_8;
    default:
      break;
    case 0x36:
      local_8 = "Unmanned Aerial Vehicle";
      return local_8;
    case 0x37:
      local_8 = "Space / Trans-atmospheric vehicle";
      return local_8;
    }
    break;
  case 0x43:
    puVar3 = (undefined1 *)std::__cxx11::string::operator[](in_RDI);
    switch(*puVar3) {
    case 0x30:
      local_8 = "Category C - No Info";
      return local_8;
    case 0x31:
      local_8 = "Emergency Vehicle";
      return local_8;
    case 0x32:
      local_8 = "Service Vehicle";
      return local_8;
    case 0x33:
      local_8 = "Point Obstacle";
      return local_8;
    case 0x34:
      local_8 = "Cluster Obstacle";
      return local_8;
    case 0x35:
      local_8 = "Line Obstacle";
      return local_8;
    }
    break;
  case 0x44:
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI);
    if (*pcVar2 == '0') {
      local_8 = "Category D - No Info";
      return local_8;
    }
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  return pcVar2;
}

Assistant:

const char* GetADSBEmitterCat (const std::string& cat)
{
    // We expect 2 characters
    if (cat.length() != 2) return cat.c_str();
    
    switch (cat[0]) {
        case 'A':
            switch (cat[1]) {
                case '0': return "Category A - No Info";
                case '1': return "Light (<15500 lbs)";
                case '2': return "Small (15500-75000 lbs)";
                case '3': return "Large (75000-300000 lbs)";
                case '4': return "High-Vortex Large";
                case '5': return "Heavy (>300000 lbs)";
                case '6': return "High Performance";
                case '7': return "Rotorcraft";
            }
            break;
        case 'B':
            switch (cat[1]) {
                case '0': return "Category B - No Info";
                case '1': return "Glider / Sailplane";
                case '2': return "Lighter-than-Air";
                case '3': return "Parachutist / Skydiver";
                case '4': return "Ultralight / hang-glider / paraglider";
                case '6': return "Unmanned Aerial Vehicle";
                case '7': return "Space / Trans-atmospheric vehicle";
            }
            break;
        case 'C':
            switch (cat[1]) {
                case '0': return "Category C - No Info";
                case '1': return "Emergency Vehicle";
                case '2': return "Service Vehicle";
                case '3': return "Point Obstacle";
                case '4': return "Cluster Obstacle";
                case '5': return "Line Obstacle";
            }
            break;
        case 'D':
            switch (cat[1]) {
                case '0': return "Category D - No Info";
            }
            break;
    }
    
    // Shouldn't be here...
    return cat.c_str();
}